

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O0

QUntypedPropertyBinding
QtPrivate::PropertyAdaptorSlotObjectHelpers::getBinding(QUntypedPropertyData *d)

{
  QPropertyAdaptorSlotObject *in_RSI;
  QPropertyBindingPrivate *in_RDI;
  QPropertyAdaptorSlotObject *adaptor;
  QPropertyBindingPrivatePtr this;
  
  this.d = &in_RDI->super_RefCounted;
  QPropertyAdaptorSlotObject::bindingData(in_RSI);
  QPropertyBindingData::binding((QPropertyBindingData *)in_RDI);
  QUntypedPropertyBinding::QUntypedPropertyBinding((QUntypedPropertyBinding *)this.d,in_RDI);
  return (QUntypedPropertyBinding)(QPropertyBindingPrivatePtr)this.d;
}

Assistant:

QUntypedPropertyBinding getBinding(const QUntypedPropertyData *d)
{
    auto adaptor = static_cast<const QtPrivate::QPropertyAdaptorSlotObject *>(d);
    return QUntypedPropertyBinding(adaptor->bindingData().binding());
}